

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O2

int speed_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  int error;
  char *__s;
  mixed_buffer *buffer;
  uint32_t size;
  uint32_t out;
  uint32_t in;
  SRC_DATA src_data;
  
  puVar1 = (undefined8 *)segment->data;
  src_data.end_of_input = 0;
  src_data._52_4_ = 0;
  src_data.src_ratio = 0.0;
  src_data.input_frames_used = 0;
  src_data.output_frames_gen = 0;
  src_data.input_frames = 0;
  src_data.output_frames = 0;
  src_data.data_in = (float *)0x0;
  src_data.data_out = (float *)0x0;
  in = 0xffffffff;
  out = 0xffffffff;
  mixed_buffer_request_read(&src_data.data_in,&in,(mixed_buffer *)*puVar1);
  mixed_buffer_request_write(&src_data.data_out,&out,(mixed_buffer *)puVar1[1]);
  src_data.src_ratio = 1.0 / (double)puVar1[3];
  src_data.input_frames = (long)in;
  src_data.output_frames = (long)out;
  if (out == 0 || src_data.input_frames == 0) {
    buffer = (mixed_buffer *)puVar1[1];
    size = 0;
  }
  else {
    error = src_process((SRC_STATE *)puVar1[2],&src_data);
    if (error != 0) {
      __s = src_strerror(error);
      puts(__s);
      mixed_err(0xf);
      return 0;
    }
    mixed_buffer_finish_read((uint32_t)src_data.input_frames_used,(mixed_buffer *)*puVar1);
    buffer = (mixed_buffer *)puVar1[1];
    size = (uint32_t)src_data.output_frames_gen;
  }
  mixed_buffer_finish_write(size,buffer);
  return 1;
}

Assistant:

int speed_segment_mix(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  SRC_DATA src_data = {0};
  uint32_t in = UINT32_MAX, out = UINT32_MAX;
  mixed_buffer_request_read((float **)&src_data.data_in, &in, data->in);
  mixed_buffer_request_write(&src_data.data_out, &out, data->out);
  src_data.src_ratio = 1.0 / data->speed;
  src_data.input_frames = in;
  src_data.output_frames = out;
  if(src_data.input_frames && src_data.output_frames){
    int e = src_process(data->resample_state, &src_data);
    if(e){
      printf("%s\n", src_strerror(e));
      mixed_err(MIXED_RESAMPLE_FAILED);
      return 0;
    }
    mixed_buffer_finish_read(src_data.input_frames_used, data->in);
    mixed_buffer_finish_write(src_data.output_frames_gen, data->out);
  }else{
    mixed_buffer_finish_write(0, data->out);
  }
  return 1;
}